

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O2

void mpc_sbox_prove_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint64_t x0s [3];
  uint64_t x2m [3];
  uint64_t x1s [3];
  uint64_t r2m [3];
  uint64_t r1m [3];
  uint64_t r0m [3];
  uint64_t r1s [3];
  uint64_t r0s [3];
  
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    uVar3 = *(ulong *)((long)in + lVar2);
    uVar1 = *(ulong *)((long)rvec + lVar2);
    *(ulong *)((long)x2m + lVar2) = uVar3 & 0x9249249000000000;
    *(ulong *)((long)r1m + lVar2) = uVar1 & 0x4924924800000000;
    *(ulong *)((long)r0m + lVar2) = uVar1 & 0x2492492400000000;
    *(ulong *)((long)x1s + lVar2) = uVar3 * 2 & 0x9249249000000000;
    *(ulong *)((long)r2m + lVar2) = uVar1 & 0x9249249000000000;
    *(ulong *)((long)r1s + lVar2) = (uVar1 & 0x4924924800000000) * 2;
    *(ulong *)((long)x0s + lVar2) = uVar3 * 4 & 0x9249249000000000;
    *(ulong *)((long)r0s + lVar2) = (uVar1 & 0x2492492400000000) << 2;
  }
  mpc_and_uint64(r0m,x0s,x1s,r2m,view,0);
  mpc_and_uint64(r2m,x1s,x2m,r1s,view,1);
  mpc_and_uint64(r1m,x0s,x2m,r0s,view,2);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    uVar3 = *(ulong *)((long)x0s + lVar2) ^ *(ulong *)((long)x1s + lVar2);
    *(ulong *)((long)in + lVar2) =
         (*(ulong *)((long)r1m + lVar2) ^ uVar3) >> 1 ^ *(ulong *)((long)in + lVar2) & 0x3ffffffff ^
         uVar3 ^ (*(ulong *)((long)r2m + lVar2) ^ *(ulong *)((long)x0s + lVar2)) >> 2 ^
                 *(ulong *)((long)r0m + lVar2) ^ *(ulong *)((long)x2m + lVar2);
  }
  return;
}

Assistant:

static void mpc_sbox_prove_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_PROOF);

  mpc_and_uint64(r0m, x0s, x1s, r2m, view, 0);
  mpc_and_uint64(r2m, x1s, x2m, r1s, view, 1);
  mpc_and_uint64(r1m, x0s, x2m, r0s, view, 2);

  bitsliced_step_2_uint64_10(SC_PROOF - 1);
}